

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsData.cpp
# Opt level: O2

int32_t helicsDataBufferFillFromVector(HelicsDataBuffer data,double *value,int dataSize)

{
  SmallBuffer *store;
  int32_t iVar1;
  
  store = getBuffer(data);
  iVar1 = 0;
  if (store != (SmallBuffer *)0x0) {
    helics::ValueConverter<double>::convert(value,(long)dataSize,store);
    iVar1 = (int32_t)store->bufferSize;
  }
  return iVar1;
}

Assistant:

int32_t helicsDataBufferFillFromVector(HelicsDataBuffer data, const double* value, int dataSize)
{
    auto* ptr = getBuffer(data);
    if (ptr == nullptr) {
        return 0;
    }
    try {
        helics::ValueConverter<double>::convert(value, dataSize, *ptr);
        return static_cast<int32_t>(ptr->size());
    }
    catch (const std::bad_alloc&) {
        return 0;
    }
}